

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  int iVar1;
  char *pcVar2;
  gap *pgVar3;
  undefined1 *in_RDI;
  char_t ch_1;
  char_t ch;
  uint ucsc;
  char_t *stre;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffda;
  char cVar4;
  undefined1 in_stack_ffffffffffffffdb;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar5;
  
  iVar1 = (int)(char)in_RDI[1];
  if (iVar1 != 0x23) {
    if (iVar1 == 0x61) {
      pcVar2 = in_RDI + 2;
      if (*pcVar2 == 'm') {
        if (in_RDI[3] != 'p') {
          return in_RDI + 3;
        }
        if (in_RDI[4] != ';') {
          return in_RDI + 4;
        }
        *in_RDI = 0x26;
        pgVar3 = (gap *)(in_RDI + 5);
        gap::push(pgVar3,(char_t **)
                         CONCAT44(in_stack_ffffffffffffffdc,
                                  CONCAT13(in_stack_ffffffffffffffdb,
                                           CONCAT12(in_stack_ffffffffffffffda,
                                                    in_stack_ffffffffffffffd8))),
                  CONCAT44(0x61,in_stack_ffffffffffffffd0));
        return (char_t *)pgVar3;
      }
      if (*pcVar2 != 'p') {
        return pcVar2;
      }
      if (in_RDI[3] != 'o') {
        return in_RDI + 3;
      }
      if (in_RDI[4] != 's') {
        return in_RDI + 4;
      }
      if (in_RDI[5] != ';') {
        return in_RDI + 5;
      }
      *in_RDI = 0x27;
      pgVar3 = (gap *)(in_RDI + 6);
      gap::push(pgVar3,(char_t **)
                       CONCAT44(in_stack_ffffffffffffffdc,
                                CONCAT13(in_stack_ffffffffffffffdb,
                                         CONCAT12(in_stack_ffffffffffffffda,
                                                  in_stack_ffffffffffffffd8))),
                CONCAT44(0x61,in_stack_ffffffffffffffd0));
      return (char_t *)pgVar3;
    }
    if (iVar1 == 0x67) {
      if (in_RDI[2] != 't') {
        return in_RDI + 2;
      }
      if (in_RDI[3] != ';') {
        return in_RDI + 3;
      }
      *in_RDI = 0x3e;
      pgVar3 = (gap *)(in_RDI + 4);
      gap::push(pgVar3,(char_t **)
                       CONCAT44(in_stack_ffffffffffffffdc,
                                CONCAT13(in_stack_ffffffffffffffdb,
                                         CONCAT12(in_stack_ffffffffffffffda,
                                                  in_stack_ffffffffffffffd8))),
                CONCAT44(0x67,in_stack_ffffffffffffffd0));
      return (char_t *)pgVar3;
    }
    if (iVar1 != 0x6c) {
      if (iVar1 != 0x71) {
        return in_RDI + 1;
      }
      if (in_RDI[2] != 'u') {
        return in_RDI + 2;
      }
      if (in_RDI[3] != 'o') {
        return in_RDI + 3;
      }
      if (in_RDI[4] != 't') {
        return in_RDI + 4;
      }
      if (in_RDI[5] != ';') {
        return in_RDI + 5;
      }
      *in_RDI = 0x22;
      pgVar3 = (gap *)(in_RDI + 6);
      gap::push(pgVar3,(char_t **)
                       CONCAT44(in_stack_ffffffffffffffdc,
                                CONCAT13(in_stack_ffffffffffffffdb,
                                         CONCAT12(in_stack_ffffffffffffffda,
                                                  in_stack_ffffffffffffffd8))),
                CONCAT44(0x71,in_stack_ffffffffffffffd0));
      return (char_t *)pgVar3;
    }
    if (in_RDI[2] != 't') {
      return in_RDI + 2;
    }
    if (in_RDI[3] != ';') {
      return in_RDI + 3;
    }
    *in_RDI = 0x3c;
    pgVar3 = (gap *)(in_RDI + 4);
    gap::push(pgVar3,(char_t **)
                     CONCAT44(in_stack_ffffffffffffffdc,
                              CONCAT13(in_stack_ffffffffffffffdb,
                                       CONCAT12(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8)
                                      )),CONCAT44(0x6c,in_stack_ffffffffffffffd0));
    return (char_t *)pgVar3;
  }
  iVar5 = 0;
  if (in_RDI[2] == 'x') {
    pcVar2 = in_RDI + 3;
    cVar4 = *pcVar2;
    if (cVar4 == ';') {
      return pcVar2;
    }
    do {
      if ((int)cVar4 - 0x30U < 10) {
        iVar5 = iVar5 * 0x10 + cVar4 + -0x30;
      }
      else {
        if (5 < ((int)cVar4 | 0x20U) - 0x61) goto LAB_001341cc;
        iVar5 = iVar5 * 0x10 + (((int)cVar4 | 0x20U) - 0x57);
      }
      cVar4 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
  pcVar2 = in_RDI + 2;
  cVar4 = in_RDI[2];
  if (cVar4 == ';') {
    return pcVar2;
  }
  while ((int)cVar4 - 0x30U < 10) {
    iVar5 = iVar5 * 10 + cVar4 + -0x30;
    cVar4 = pcVar2[1];
    pcVar2 = pcVar2 + 1;
  }
  if (cVar4 != ';') {
    return pcVar2;
  }
  in_stack_ffffffffffffffda = 0x3b;
LAB_001342b1:
  pgVar3 = (gap *)(pcVar2 + 1);
  utf8_writer::any((value_type)CONCAT44(0x23,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  gap::push(pgVar3,(char_t **)
                   CONCAT44(iVar5,CONCAT13(in_stack_ffffffffffffffdb,
                                           CONCAT12(in_stack_ffffffffffffffda,
                                                    in_stack_ffffffffffffffd8))),
            CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  return (char_t *)pgVar3;
LAB_001341cc:
  if (cVar4 != ';') {
    return pcVar2;
  }
  in_stack_ffffffffffffffdb = 0x3b;
  goto LAB_001342b1;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}